

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

Optimizer *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::Optimizer>(Arena *arena)

{
  Optimizer *this;
  
  if (arena == (Arena *)0x0) {
    this = (Optimizer *)operator_new(0x20);
    CoreML::Specification::Optimizer::Optimizer(this,(Arena *)0x0,false);
  }
  else {
    this = (Optimizer *)
           AllocateAlignedWithHook
                     (arena,0x20,(type_info *)&CoreML::Specification::Optimizer::typeinfo);
    CoreML::Specification::Optimizer::Optimizer(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }